

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest9::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest9 *this,_test_case *test_case)

{
  stringstream result_sstream;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void subroutineType(inout vec4 test);\n\nsubroutine(subroutineType) void test_function(inout vec4 test)\n{\n    test += vec4(0, 1, 2, 3);\n}\n\nsubroutine uniform subroutineType function;\n\n"
                 );
  if ((ulong)*test_case < 3) {
    std::operator<<(&local_190,&DAT_016afd5c + *(int *)(&DAT_016afd5c + (ulong)*test_case * 4));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest9::getVertexShader(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  /* Define a subroutine */
					  "subroutine void subroutineType(inout vec4 test);\n"
					  "\n"
					  "subroutine(subroutineType) void test_function(inout vec4 test)\n"
					  "{\n"
					  "    test += vec4(0, 1, 2, 3);\n"
					  "}\n"
					  "\n"
					  "subroutine uniform subroutineType function;\n"
					  "\n";

	/* Include case-specific implementation */
	switch (test_case)
	{
	case TEST_CASE_INVALID_FLOAT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    function = 1.0f;\n"
						  "\n"
						  "    function(gl_Position);\n"
						  "}\n";

		break;
	}

	case TEST_CASE_INVALID_INT_TO_SUBROUTINE_UNIFORM_ASSIGNMENT:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    function = 1;\n"
						  "\n"
						  "    function(gl_Position);\n"
						  "}\n";

		break;
	}

	case TEST_CASE_INVALID_SUBROUTINE_UNIFORM_VALUE_COMPARISON:
	{
		result_sstream << "subroutine uniform subroutineType function2;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    if (function == function2)\n"
						  "    {\n"
						  "        function(gl_Position);\n"
						  "    }\n"
						  "    else\n"
						  "    {\n"
						  "        function2(gl_Position);\n"
						  "    }\n"
						  "}\n";

		break;
	}

	default:
		break;
	} /* switch (test_case) */

	/* Done */
	return result_sstream.str();
}